

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Video.hpp
# Opt level: O0

bool __thiscall
Apple::II::Video::
Video<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)3,_false>::VideoBusHandler,_true>
::get_is_vertical_blank
          (Video<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)3,_false>::VideoBusHandler,_true>
           *this,Cycles offset)

{
  int iVar1;
  IntType IVar2;
  int mapped_row;
  int mapped_column;
  Video<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)3,_false>::VideoBusHandler,_true>
  *this_local;
  Cycles offset_local;
  
  iVar1 = (this->super_VideoBase).column_;
  this_local = (Video<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)3,_false>::VideoBusHandler,_true>
                *)offset.super_WrappedInt<Cycles>.length_;
  IVar2 = WrappedInt<Cycles>::as_integral((WrappedInt<Cycles> *)&this_local);
  return ((this->super_VideoBase).row_ + (iVar1 + (int)IVar2 + 0x19) / 0x41) % 0x106 < 0xc0;
}

Assistant:

bool get_is_vertical_blank(Cycles offset) {
			// Determine column at offset.
			int mapped_column = column_ + int(offset.as_integral());

			// Map that backwards from the internal pixels-at-start generation to pixels-at-end
			// (so what was column 0 is now column 25).
			mapped_column += 25;

			// Apply carry into the row counter.
			int mapped_row = row_ + (mapped_column / 65);
			mapped_row %= 262;

			// Per http://www.1000bit.it/support/manuali/apple/technotes/iigs/tn.iigs.040.html
			// "on the IIe, the screen is blanked when the bit is low".
			return mapped_row < 192;
		}